

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O2

void * __thiscall ImportedFuncWrapper::getValuePtr(ImportedFuncWrapper *this,FieldID fId)

{
  ExeNodeWrapper *pEVar1;
  Executable *pEVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  bufsize_t bVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  bool isOk;
  
  isOk = SUB81((ulong)in_RAX >> 0x38,0);
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    return (void *)0x0;
  }
  bVar3 = ExeElementWrapper::isBit64((ExeElementWrapper *)this);
  pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
  iVar4 = (*(pEVar1->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer
            [0x1c])(pEVar1,(long)fId,0xffffffffffffffff,&isOk);
  if (isOk == true) {
    lVar6 = (long)iVar4;
    if (bVar3) {
      lVar6 = CONCAT44(extraout_var,iVar4);
    }
    if (1 < lVar6 + 1U) {
      bVar5 = ImportBaseFuncWrapper::getAddrSize(&this->super_ImportBaseFuncWrapper);
      pEVar2 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar4 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                        (pEVar2,(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                super_ExeNodeWrapper.entryNum * bVar5 + lVar6,2,0);
      pEVar2 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar4 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar2,CONCAT44(extraout_var_00,iVar4),bVar5,0);
      return (void *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return (void *)0x0;
}

Assistant:

void* ImportedFuncWrapper::getValuePtr(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return NULL;
    bool is64 = isBit64();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) {
        //printf("Failed getting value!\n");
        return NULL;
    }
    if (!is64) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 || thunkRva == -1) return NULL;

    bufsize_t thunkValSize = this->getThunkValSize();
    offset_t offset = static_cast<offset_t>(this->entryNum) * thunkValSize;

    offset_t thunkAddr = m_Exe->toRaw(thunkRva + offset, Executable::RVA);
    void* thunkPtr = m_Exe->getContentAt(thunkAddr, thunkValSize);
    return thunkPtr;
}